

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utilities.cpp
# Opt level: O2

void __thiscall ThreadedImageSaver::runThread(ThreadedImageSaver *this)

{
  pointer ppVar1;
  unique_lock<std::mutex> l;
  type img;
  allocator<char> local_b1;
  unique_lock *local_b0;
  unique_lock<std::mutex> local_a8;
  string local_98;
  pair<Image,_std::filesystem::__cxx11::path> local_78;
  
  std::unique_lock<std::mutex>::unique_lock(&local_a8,&this->mtx);
  local_b0 = (unique_lock *)&this->cv;
  while (this->stopped == false) {
    std::condition_variable::wait(local_b0);
    while (ppVar1 = (this->images).
                    super__Vector_base<std::pair<Image,_std::filesystem::__cxx11::path>,_std::allocator<std::pair<Image,_std::filesystem::__cxx11::path>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
          (this->images).
          super__Vector_base<std::pair<Image,_std::filesystem::__cxx11::path>,_std::allocator<std::pair<Image,_std::filesystem::__cxx11::path>_>_>
          ._M_impl.super__Vector_impl_data._M_start != ppVar1) {
      std::pair<Image,_std::filesystem::__cxx11::path>::pair(&local_78,ppVar1 + -1);
      std::
      vector<std::pair<Image,_std::filesystem::__cxx11::path>,_std::allocator<std::pair<Image,_std::filesystem::__cxx11::path>_>_>
      ::pop_back(&this->images);
      std::unique_lock<std::mutex>::unlock(&local_a8);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_b1);
      Image::writePNG(&local_78.first,&local_78.second,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::unique_lock<std::mutex>::lock(&local_a8);
      std::pair<Image,_std::filesystem::__cxx11::path>::~pair(&local_78);
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_a8);
  return;
}

Assistant:

void ThreadedImageSaver::runThread() {
	std::unique_lock<std::mutex> l(mtx);
	while (!stopped) {
		cv.wait(l);
		while (!images.empty()) {
			auto img = std::move(images.back());
			images.pop_back();
			l.unlock();
			img.first.writePNG(img.second);
			l.lock();
		}
	}
}